

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem *items,int count,float width_excess)

{
  bool bVar1;
  int in_ESI;
  void *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 extraout_var [60];
  undefined1 auVar4 [60];
  int n_1;
  float width_rounded;
  int n;
  int item_n;
  float width_to_remove_per_item;
  float max_width_to_remove_per_item;
  int count_same_width;
  float local_34;
  int local_2c;
  int local_24;
  int local_20;
  int local_14;
  float local_10;
  
  if (in_ESI == 1) {
    fVar2 = ImMax<float>(*(float *)((long)in_RDI + 4) - in_XMM0_Da,1.0);
    *(float *)((long)in_RDI + 4) = fVar2;
  }
  else {
    qsort(in_RDI,(long)in_ESI,8,ShrinkWidthItemComparer);
    local_14 = 1;
    local_10 = in_XMM0_Da;
    while (0.0 < local_10 && local_14 < in_ESI) {
      while( true ) {
        bVar1 = false;
        if (local_14 < in_ESI) {
          bVar1 = *(float *)((long)in_RDI + 4) <= *(float *)((long)in_RDI + (long)local_14 * 8 + 4);
        }
        if (!bVar1) break;
        local_14 = local_14 + 1;
      }
      if (local_14 < in_ESI) {
        local_34 = *(float *)((long)in_RDI + 4) - *(float *)((long)in_RDI + (long)local_14 * 8 + 4);
      }
      else {
        local_34 = *(float *)((long)in_RDI + 4) - 1.0;
      }
      fVar2 = ImMin<float>(local_10 / (float)local_14,local_34);
      auVar4 = extraout_var;
      for (local_20 = 0; local_20 < local_14; local_20 = local_20 + 1) {
        auVar4 = (undefined1  [60])0x0;
        *(float *)((long)in_RDI + (long)local_20 * 8 + 4) =
             *(float *)((long)in_RDI + (long)local_20 * 8 + 4) - fVar2;
      }
      auVar3._0_4_ = (float)local_14;
      auVar3._4_12_ = auVar4._0_12_;
      auVar3 = vfmadd213ss_fma(auVar3,ZEXT416((uint)-fVar2),ZEXT416((uint)local_10));
      local_10 = auVar3._0_4_;
    }
    local_10 = 0.0;
    for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
      fVar2 = ImFloor(*(float *)((long)in_RDI + (long)local_24 * 8 + 4));
      local_10 = (*(float *)((long)in_RDI + (long)local_24 * 8 + 4) - fVar2) + local_10;
      *(float *)((long)in_RDI + (long)local_24 * 8 + 4) = fVar2;
    }
    if (0.0 < local_10) {
      for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
        if (*(int *)((long)in_RDI + (long)local_2c * 8) < (int)(local_10 + 0.01)) {
          *(float *)((long)in_RDI + (long)local_2c * 8 + 4) =
               *(float *)((long)in_RDI + (long)local_2c * 8 + 4) + 1.0;
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem* items, int count, float width_excess)
{
    if (count == 1)
    {
        items[0].Width = ImMax(items[0].Width - width_excess, 1.0f);
        return;
    }
    ImQsort(items, (size_t)count, sizeof(ImGuiShrinkWidthItem), ShrinkWidthItemComparer);
    int count_same_width = 1;
    while (width_excess > 0.0f && count_same_width < count)
    {
        while (count_same_width < count && items[0].Width <= items[count_same_width].Width)
            count_same_width++;
        float max_width_to_remove_per_item = (count_same_width < count) ? (items[0].Width - items[count_same_width].Width) : (items[0].Width - 1.0f);
        float width_to_remove_per_item = ImMin(width_excess / count_same_width, max_width_to_remove_per_item);
        for (int item_n = 0; item_n < count_same_width; item_n++)
            items[item_n].Width -= width_to_remove_per_item;
        width_excess -= width_to_remove_per_item * count_same_width;
    }

    // Round width and redistribute remainder left-to-right (could make it an option of the function?)
    // Ensure that e.g. the right-most tab of a shrunk tab-bar always reaches exactly at the same distance from the right-most edge of the tab bar separator.
    width_excess = 0.0f;
    for (int n = 0; n < count; n++)
    {
        float width_rounded = ImFloor(items[n].Width);
        width_excess += items[n].Width - width_rounded;
        items[n].Width = width_rounded;
    }
    if (width_excess > 0.0f)
        for (int n = 0; n < count; n++)
            if (items[n].Index < (int)(width_excess + 0.01f))
                items[n].Width += 1.0f;
}